

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_heap.hpp
# Opt level: O1

void unodb::test::allocation_failure_injector::maybe_fail(void)

{
  long in_FS_OFFSET;
  
  if ((*(char *)(in_FS_OFFSET + -7) == '\0') &&
     (fail_on_nth_allocation_.super___atomic_base<unsigned_long>._M_i != 0)) {
    maybe_fail((allocation_failure_injector *)
               fail_on_nth_allocation_.super___atomic_base<unsigned_long>._M_i);
    return;
  }
  return;
}

Assistant:

static void maybe_fail() {
    // Inspects the fail counter.  If non-zero, then bumps the allocation
    // counter.  If that results in the allocation counter reaching or exceeding
    // the fail counter, then throw std::bad_alloc.
    if (UNODB_DETAIL_UNLIKELY(paused)) return;
    const auto fail_counter =
        fail_on_nth_allocation_.load(std::memory_order_acquire);
    if (UNODB_DETAIL_UNLIKELY(fail_counter != 0) &&
        (allocation_counter.fetch_add(1, std::memory_order_relaxed) >=
         fail_counter - 1)) {
      throw std::bad_alloc{};
    }
  }